

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::duel_cmd(int cid,char **args,int argc)

{
  char *s;
  char *__s1;
  bool bVar1;
  bool bVar2;
  int iVar3;
  clientinfo *ci_00;
  stringformatter local_270;
  char local_268 [8];
  string f_1;
  bool valid_1;
  char local_158 [8];
  string f;
  uint local_4c;
  int dueltimer;
  clientinfo *ci;
  int i;
  bool valid;
  int gm;
  char *mn;
  char *mapname;
  int argc_local;
  char **args_local;
  int cid_local;
  
  s = args[2];
  __s1 = args[1];
  bVar1 = QServ::getlastSA(&qs);
  if ((((bVar1) && (args[1] != (char *)0x0)) && (args[2] != (char *)0x0)) &&
     ((*s != '\0' && (*__s1 != '\0')))) {
    bVar1 = false;
    for (ci._4_4_ = 0; ci._4_4_ <= mcduel; ci._4_4_ = ci._4_4_ + 1) {
      iVar3 = strcmp(__s1,qserv_modenames[ci._4_4_]);
      if (iVar3 == 0) {
        i = ci._4_4_;
        changemap(s,ci._4_4_);
        bVar1 = true;
        break;
      }
    }
    bVar2 = QServ::getlastSA(&qs);
    if ((bVar2) && (bVar1)) {
      iVar3 = QServ::getSender(&qs);
      ci_00 = QServ::getClient(&qs,iVar3);
      persist = 1;
      pausegame(true,ci_00);
      for (local_4c = dueltimermillis; (int)local_4c <= (int)dueltimermillis && local_4c != 0;
          local_4c = local_4c - 1) {
        out(3,"\f2Get ready! Starting duel in %d:%d",
            (long)((ulong)(uint)((int)((long)(int)local_4c / 1000) >> 0x1f) << 0x20 |
                  (long)(int)local_4c / 1000 & 0xffffffffU) % 1000 & 0xffffffff,(ulong)local_4c);
      }
      pausegame(false,ci_00);
      stringformatter::stringformatter((stringformatter *)(f_1 + 0x100),local_158);
      stringformatter::operator()
                ((stringformatter *)(f_1 + 0x100),
                 "\f2Duel has started: %s on map %s. Good luck, have fun.",qserv_modenames[i],s);
      sendf(-1,1,"ris",0x23,local_158);
    }
    if (!bVar1) {
      iVar3 = QServ::getSender(&qs);
      sendf(iVar3,1,"ris",0x23,"\f3Error: Unknown mode");
    }
  }
  else {
    f_1[0xff] = '\0';
    stringformatter::stringformatter(&local_270,local_268);
    stringformatter::operator()(&local_270,"\f3Error: Invalid mode/mapname provided");
    iVar3 = QServ::getSender(&qs);
    sendf(iVar3,1,"ris",0x23,local_268);
  }
  return;
}

Assistant:

QSERV_CALLBACK duel_cmd(p) {
        const char *mapname = args[2];
        char *mn = args[1];
        if(CMD_SA && args[1] != NULL && args[2] != NULL && *mapname !=NULL && *mn!=NULL) {
            int gm; // default set to current mode td
            bool valid = false;
            
            // intialize this for perf
            for(int i = 0; i <= mcduel; i++)  {
                if(!strcmp(mn, qserv_modenames[i]))  {
                    gm = i;
                    // use other list to send full name of mode
                    changemap(mapname, gm);
                    valid = true;
                    break;
                }
            }
            if(CMD_SA && valid) {
                clientinfo *ci = qs.getClient(CMD_SENDER);
                server::persist = true;
                pausegame(true,ci);
                int dueltimer;
                for(dueltimer = dueltimermillis; dueltimer <= dueltimermillis && dueltimer != (0); --dueltimer) {
                    out(ECHO_SERV, "\f2Get ready! Starting duel in %d:%d",(dueltimer/1000) % 1000,dueltimer);
                }
                pausegame(false,ci);
                defformatstring(f)("\f2Duel has started: %s on map %s. Good luck, have fun.", qserv_modenames[gm], mapname);
                sendf(-1, 1, "ris", N_SERVMSG, f);
            }
            
            if(!valid) {sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Unknown mode");}
        }
        else {
            bool valid = false;
            defformatstring(f)("\f3Error: Invalid mode/mapname provided");
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, f);
        }
    }